

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateOptimizer(Result *__return_storage_ptr__,Optimizer *optimizer)

{
  AdamOptimizer *pAVar1;
  SGDOptimizer *pSVar2;
  bool bVar3;
  undefined1 *puVar4;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [40];
  string err;
  Result r;
  
  CoreML::Result::Result(&r);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if (optimizer->_oneof_case_[0] == 10) {
    pSVar2 = (optimizer->OptimizerType_).sgdoptimizer_;
    if ((pSVar2 == (SGDOptimizer *)CoreML::Specification::_SGDOptimizer_default_instance_) ||
       (pSVar2->learningrate_ == (DoubleParameter *)0x0)) {
LAB_0027d964:
      std::__cxx11::string::assign((char *)&err);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      goto LAB_0027d9b3;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"learningRate",&local_a9)
    ;
    puVar4 = (undefined1 *)pSVar2->learningrate_;
    if ((DoubleParameter *)puVar4 == (DoubleParameter *)0x0) {
      puVar4 = CoreML::Specification::_DoubleParameter_default_instance_;
    }
    CoreML::validateDoubleParameter((Result *)local_88,&local_a8,(DoubleParameter *)puVar4);
    CoreML::Result::operator=(&r,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::__cxx11::string::~string((string *)&local_a8);
    bVar3 = CoreML::Result::good(&r);
    if (bVar3) {
      if (pSVar2->minibatchsize_ == (Int64Parameter *)0x0) goto LAB_0027d964;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"miniBatchSize",&local_a9);
      puVar4 = (undefined1 *)pSVar2->minibatchsize_;
      if ((Int64Parameter *)puVar4 == (Int64Parameter *)0x0) {
        puVar4 = CoreML::Specification::_Int64Parameter_default_instance_;
      }
      CoreML::validateInt64Parameter((Result *)local_88,&local_a8,(Int64Parameter *)puVar4,true);
      CoreML::Result::operator=(&r,(Result *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 8));
      std::__cxx11::string::~string((string *)&local_a8);
      CoreML::Result::good(&r);
    }
  }
  else {
    if (optimizer->_oneof_case_[0] != 0xb) {
      std::__cxx11::string::assign((char *)&err);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      goto LAB_0027d9b3;
    }
    pAVar1 = (optimizer->OptimizerType_).adamoptimizer_;
    if ((pAVar1 == (AdamOptimizer *)CoreML::Specification::_AdamOptimizer_default_instance_) ||
       (pAVar1->learningrate_ == (DoubleParameter *)0x0)) {
LAB_0027d999:
      std::__cxx11::string::assign((char *)&err);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      goto LAB_0027d9b3;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"learningRate",&local_a9)
    ;
    puVar4 = (undefined1 *)pAVar1->learningrate_;
    if ((DoubleParameter *)puVar4 == (DoubleParameter *)0x0) {
      puVar4 = CoreML::Specification::_DoubleParameter_default_instance_;
    }
    CoreML::validateDoubleParameter((Result *)local_88,&local_a8,(DoubleParameter *)puVar4);
    CoreML::Result::operator=(&r,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::__cxx11::string::~string((string *)&local_a8);
    bVar3 = CoreML::Result::good(&r);
    if (bVar3) {
      if (pAVar1->minibatchsize_ == (Int64Parameter *)0x0) goto LAB_0027d999;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"miniBatchSize",&local_a9);
      puVar4 = (undefined1 *)pAVar1->minibatchsize_;
      if ((Int64Parameter *)puVar4 == (Int64Parameter *)0x0) {
        puVar4 = CoreML::Specification::_Int64Parameter_default_instance_;
      }
      CoreML::validateInt64Parameter((Result *)local_88,&local_a8,(Int64Parameter *)puVar4,true);
      CoreML::Result::operator=(&r,(Result *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 8));
      std::__cxx11::string::~string((string *)&local_a8);
      bVar3 = CoreML::Result::good(&r);
      if (bVar3) {
        if (pAVar1->beta1_ == (DoubleParameter *)0x0) goto LAB_0027d999;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"beta1",&local_a9);
        puVar4 = (undefined1 *)pAVar1->beta1_;
        if ((DoubleParameter *)puVar4 == (DoubleParameter *)0x0) {
          puVar4 = CoreML::Specification::_DoubleParameter_default_instance_;
        }
        CoreML::validateDoubleParameter((Result *)local_88,&local_a8,(DoubleParameter *)puVar4);
        CoreML::Result::operator=(&r,(Result *)local_88);
        std::__cxx11::string::~string((string *)(local_88 + 8));
        std::__cxx11::string::~string((string *)&local_a8);
        bVar3 = CoreML::Result::good(&r);
        if (bVar3) {
          if (pAVar1->beta2_ == (DoubleParameter *)0x0) goto LAB_0027d999;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"beta2",&local_a9);
          puVar4 = (undefined1 *)pAVar1->beta2_;
          if ((DoubleParameter *)puVar4 == (DoubleParameter *)0x0) {
            puVar4 = CoreML::Specification::_DoubleParameter_default_instance_;
          }
          CoreML::validateDoubleParameter((Result *)local_88,&local_a8,(DoubleParameter *)puVar4);
          CoreML::Result::operator=(&r,(Result *)local_88);
          std::__cxx11::string::~string((string *)(local_88 + 8));
          std::__cxx11::string::~string((string *)&local_a8);
          bVar3 = CoreML::Result::good(&r);
          if (bVar3) {
            if (pAVar1->eps_ == (DoubleParameter *)0x0) goto LAB_0027d999;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"eps",&local_a9);
            puVar4 = (undefined1 *)pAVar1->eps_;
            if ((DoubleParameter *)puVar4 == (DoubleParameter *)0x0) {
              puVar4 = CoreML::Specification::_DoubleParameter_default_instance_;
            }
            CoreML::validateDoubleParameter((Result *)local_88,&local_a8,(DoubleParameter *)puVar4);
            CoreML::Result::operator=(&r,(Result *)local_88);
            std::__cxx11::string::~string((string *)(local_88 + 8));
            std::__cxx11::string::~string((string *)&local_a8);
            CoreML::Result::good(&r);
          }
        }
      }
    }
  }
  CoreML::Result::Result(__return_storage_ptr__,&r);
LAB_0027d9b3:
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

static Result validateOptimizer(const Specification::Optimizer& optimizer) {
    Result r;
    std::string err;
    
    switch (optimizer.OptimizerType_case()) {
        case Specification::Optimizer::kSgdOptimizer:
        {
            const Specification::SGDOptimizer &sgdOptimizer = optimizer.sgdoptimizer();
            
            if (false == sgdOptimizer.has_learningrate()) {
                err = "SGD optimizer should include learningRate parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("learningRate", sgdOptimizer.learningrate());
            if (!r.good()) {return r;}
            
            if (false == sgdOptimizer.has_minibatchsize()) {
                err = "SGD optimizer should include miniBatchSize parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateInt64Parameter("miniBatchSize", sgdOptimizer.minibatchsize(), true);
            if (!r.good()) {return r;}
            
            break;
        }
        case Specification::Optimizer::kAdamOptimizer:
        {
            const Specification::AdamOptimizer &adamOptimizer = optimizer.adamoptimizer();
            
            if (false == adamOptimizer.has_learningrate()) {
                err = "ADAM optimizer should include learningRate parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("learningRate", adamOptimizer.learningrate());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_minibatchsize()) {
                err = "ADAM optimizer should include miniBatchSize parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateInt64Parameter("miniBatchSize", adamOptimizer.minibatchsize(), true);
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_beta1()) {
                err = "ADAM optimizer should include beta1 parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("beta1", adamOptimizer.beta1());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_beta2()) {
                err = "ADAM optimizer should include beta2 parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("beta2", adamOptimizer.beta2());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_eps()) {
                err = "ADAM optimizer should include eps (epslion) parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("eps", adamOptimizer.eps());
            if (!r.good()) {return r;}
    
            break;
        }
        default:
            err = "Optimizer is not recognized.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    return r;
}